

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void * __thiscall
pugi::impl::anon_unknown_0::xpath_allocator::reallocate
          (xpath_allocator *this,void *ptr,size_t old_size,size_t new_size)

{
  xpath_memory_block *pxVar1;
  ulong uVar2;
  void *__dest;
  ulong size;
  ulong __n;
  
  __n = old_size + 7 & 0xfffffffffffffff8;
  size = new_size + 7 & 0xfffffffffffffff8;
  if ((ptr == (void *)0x0) ||
     (uVar2 = (this->_root_size - __n) + size, this->_root->capacity < uVar2)) {
    __dest = allocate(this,size);
    if (__dest != (void *)0x0 && ptr != (void *)0x0) {
      memcpy(__dest,ptr,__n);
      pxVar1 = this->_root->next;
      if ((&pxVar1->field_2 == (anon_union_4096_2_e9978466_for_xpath_memory_block_2 *)ptr) &&
         (pxVar1 = pxVar1->next, pxVar1 != (xpath_memory_block *)0x0)) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
        this->_root->next = pxVar1;
      }
    }
  }
  else {
    this->_root_size = uVar2;
    __dest = ptr;
  }
  return __dest;
}

Assistant:

void* reallocate(void* ptr, size_t old_size, size_t new_size)
		{
			// round size up to block alignment boundary
			old_size = (old_size + xpath_memory_block_alignment - 1) & ~(xpath_memory_block_alignment - 1);
			new_size = (new_size + xpath_memory_block_alignment - 1) & ~(xpath_memory_block_alignment - 1);

			// we can only reallocate the last object
			assert(ptr == NULL || static_cast<char*>(ptr) + old_size == &_root->data[0] + _root_size);

			// try to reallocate the object inplace
			if (ptr && _root_size - old_size + new_size <= _root->capacity)
			{
				_root_size = _root_size - old_size + new_size;
				return ptr;
			}

			// allocate a new block
			void* result = allocate(new_size);
			if (!result) return NULL;

			// we have a new block
			if (ptr)
			{
				// copy old data (we only support growing)
				assert(new_size >= old_size);
				memcpy(result, ptr, old_size);

				// free the previous page if it had no other objects
				assert(_root->data == result);
				assert(_root->next);

				if (_root->next->data == ptr)
				{
					// deallocate the whole page, unless it was the first one
					xpath_memory_block* next = _root->next->next;

					if (next)
					{
						xml_memory::deallocate(_root->next);
						_root->next = next;
					}
				}
			}

			return result;
		}